

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O1

int mcpl2ssw(char *inmcplfile,char *outsswfile,char *refsswfile,long surface_id,
            long nparticles_limit)

{
  bool bVar1;
  uint np1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ssw_file_t ff;
  char *pcVar9;
  undefined8 *puVar10;
  long lVar11;
  double *hdrlen;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint nrss;
  long lVar15;
  int ssw_ssblen;
  char *hdrbuf;
  int64_t ssw_hdrlen;
  int ssw_reclen;
  int64_t ssw_nrsspos;
  int64_t ssw_np1pos;
  double ssb [11];
  mcpl_generic_wfilehandle_t fout;
  char ref_mcnpflavour_str [64];
  int local_144;
  undefined4 local_140;
  int local_13c;
  void *local_138;
  undefined8 local_130;
  double local_128;
  int local_120;
  int local_11c;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  double local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  double local_a8;
  char *local_98;
  mcpl_generic_wfilehandle_t local_90;
  char local_78 [72];
  
  local_118 = nparticles_limit;
  uVar6 = mcpl_open_file();
  uVar7 = mcpl_hdr_srcname(uVar6);
  uVar8 = mcpl_hdr_nparticles(uVar6);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",uVar7,uVar8);
  local_110 = surface_id;
  if ((surface_id == 0) && (iVar3 = mcpl_hdr_has_userflags(uVar6), iVar3 == 0)) {
    ssw_error(
             "MCPL file contains no userflags so parameter specifying resulting SSW surface ID of particles is mandatory (use -s<ID>)."
             );
  }
  puts("Opening reference SSW file:");
  ff = ssw_open_file(refsswfile);
  hdrlen = &local_128;
  ssw_layout(ff,&local_11c,&local_144,(int64_t *)hdrlen,&local_100,&local_108);
  local_13c = ssw_is_mcnp6(ff);
  if (local_13c == 0) {
    iVar3 = ssw_is_mcnpx(ff);
    local_140 = (undefined4)CONCAT71((int7)((ulong)hdrlen >> 8),1);
    if (iVar3 != 0) goto LAB_001044a3;
    ssw_is_mcnp5(ff);
  }
  local_140 = 0;
LAB_001044a3:
  local_78[0] = '\0';
  pcVar9 = ssw_mcnpflavour(ff);
  ssw_strcat(local_78,pcVar9,0x40);
  ssw_close_file(ff);
  mcpl_read_file_to_buffer(refsswfile,local_128,0,&local_f8,&local_138);
  if ((local_138 == (void *)0x0) || (local_f8 != local_128)) {
    ssw_error("Problems extracting header from reference file");
  }
  local_120 = *(int *)((long)local_138 + local_100);
  *(undefined4 *)((long)local_138 + local_100) = 0;
  *(undefined4 *)((long)local_138 + local_108) = 0;
  puts("Creating (or overwriting) output SSW file.");
  mcpl_generic_wfopen(&local_90,outsswfile);
  if (local_90.internal == (void *)0x0) {
    ssw_error("Problems opening new SSW file");
  }
  mcpl_generic_fwrite(&local_90,local_138,local_128);
  free(local_138);
  local_138 = (void *)0x0;
  if (local_144 - 0xcU < 0xfffffffe) {
    ssw_error("Unexpected length of ssb record in reference SSW file");
  }
  local_98 = outsswfile;
  if ((local_13c != 0) && (local_144 != 0xb)) {
    ssw_error("Unexpected length of ssb record in reference SSW file (expected 11 for MCNP6 files)")
    ;
  }
  local_f8 = 0.0;
  puts("Initiating particle conversion loop.");
  lVar15 = 0;
  lVar12 = 0;
  local_130 = uVar6;
  do {
    puVar10 = (undefined8 *)mcpl_read(uVar6);
    bVar1 = true;
    lVar13 = lVar12;
    if (puVar10 != (undefined8 *)0x0) {
      local_f8 = local_f8 + 1.0;
      local_e8 = puVar10[0xb];
      local_e0 = *puVar10;
      local_d8 = (double)puVar10[10] * 100000.0;
      local_d0 = puVar10[4];
      local_c8 = puVar10[5];
      local_c0 = puVar10[6];
      local_b8 = puVar10[7];
      local_b0 = puVar10[8];
      iVar3 = (int)local_110;
      if (iVar3 == 0) {
        iVar3 = *(int *)((long)puVar10 + 100);
      }
      if (iVar3 - 0xf4241U < 0xfff0bdc0) {
        pcVar9 = "Surface id must be in range 1..999999";
        if (iVar3 == 0) {
          pcVar9 = 
          "Could not determine surface ID: no global surface id specified and particle had no (or empty) userflags"
          ;
        }
        if (local_110 != 0) {
          pcVar9 = "Surface id must be in range 1..999999";
        }
        ssw_error(pcVar9);
      }
      iVar4 = *(int *)(puVar10 + 0xc);
      if (local_13c == 0) {
        if ((char)local_140 != '\0') {
          iVar4 = conv_mcnpx_pdg2ssw(iVar4);
          goto LAB_001046db;
        }
        uVar14 = (ulong)((uint)(iVar4 == 0x16) * 2);
        if (iVar4 == 0x840) {
          uVar14 = 1;
        }
      }
      else {
        iVar4 = conv_mcnp6_pdg2ssw(iVar4);
LAB_001046db:
        uVar14 = (ulong)iVar4;
      }
      if (uVar14 == 0) {
        lVar13 = lVar12 + 1;
        if (lVar12 < 100) {
          printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n"
                 ,(long)*(int *)(puVar10 + 0xc),local_78);
          uVar6 = local_130;
          if (lVar13 == 100) {
            puts("WARNING: Suppressing future warnings regarding non-convertible PDG codes.");
          }
          bVar1 = false;
        }
        else {
          bVar1 = false;
          uVar6 = local_130;
        }
      }
      else {
        if ((long)uVar14 < 1) {
          ssw_error("Logic error in PDG code conversions.");
        }
        uVar6 = local_130;
        if (local_13c == 0) {
          if ((char)local_140 == '\0') {
            lVar11 = (uVar14 * 100000000 + (long)iVar3) * 8;
          }
          else {
            lVar11 = uVar14 * 1000000 + (long)iVar3;
          }
          local_f0 = (double)lVar11;
          if (local_144 == 0xb) {
            local_a8 = 1.0;
          }
        }
        else {
          local_a8 = (double)iVar3;
          local_f0 = (double)(long)(uVar14 << 2);
        }
        if ((double)puVar10[9] <= 0.0 && (double)puVar10[9] != 0.0) {
          local_f0 = -local_f0;
        }
        ssw_writerecord(&local_90,local_11c,(long)local_144 << 3,(char *)&local_f8);
        lVar15 = lVar15 + 1;
        if (lVar15 == local_118) {
          lVar11 = mcpl_hdr_nparticles(uVar6);
          lVar11 = lVar11 - (lVar12 + lVar15);
          if (lVar11 != 0) {
            printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n"
                   ,local_118,lVar11);
          }
        }
        else {
          bVar1 = false;
        }
      }
    }
    lVar12 = lVar13;
    if (bVar1) {
      puts("Ending particle conversion loop.");
      if (lVar13 != 0) {
        printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to MCNP types.\n"
               ,lVar13);
      }
      pcVar9 = local_98;
      nrss = (uint)lVar15;
      uVar5 = nrss;
      if (nrss == 0) {
        puts(
            "WARNING: Input MCPL file has 0 useful particles but we are setting number of histories in new SSW file to 1 to avoid creating an invalid file."
            );
        uVar5 = 1;
      }
      uVar2 = uVar5;
      if ((int)uVar5 < 1) {
        uVar2 = -uVar5;
      }
      np1 = -uVar5;
      if (-1 < local_120) {
        np1 = uVar5;
      }
      ssw_update_nparticles(&local_90,local_100,np1,local_108,nrss);
      mcpl_close_file(uVar6);
      mcpl_generic_fwclose(&local_90);
      printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",pcVar9,
             (long)(int)nrss,(ulong)uVar2);
      return 1;
    }
  } while( true );
}

Assistant:

int mcpl2ssw(const char * inmcplfile, const char * outsswfile, const char * refsswfile,
             long surface_id, long nparticles_limit)
{

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  if (surface_id==0 && !mcpl_hdr_has_userflags(fmcpl))
    ssw_error("MCPL file contains no userflags so parameter specifying "
              "resulting SSW surface ID of particles is mandatory (use -s<ID>).");

  printf("Opening reference SSW file:\n");
  ssw_file_t fsswref = ssw_open_file(refsswfile);

  //Open reference file and figure out variables like header length, position of
  //"nparticles"-like variables, fortran record length and mcnp version.
  int ssw_reclen;
  int ssw_ssblen;
  int64_t ssw_hdrlen;
  int64_t ssw_np1pos;
  int64_t ssw_nrsspos;
  ssw_layout(fsswref, &ssw_reclen, &ssw_ssblen, &ssw_hdrlen, &ssw_np1pos, &ssw_nrsspos);
  assert(ssw_np1pos<ssw_hdrlen);
  assert(ssw_nrsspos<ssw_hdrlen);

#define SSW_MCNP6 1
#define SSW_MCNPX 2
#define SSW_MCNP5 3
  int ssw_mcnp_type = 0;
  if (ssw_is_mcnp6(fsswref)) {
    ssw_mcnp_type = SSW_MCNP6;
  } else if (ssw_is_mcnpx(fsswref)) {
    ssw_mcnp_type = SSW_MCNPX;
  } else if (ssw_is_mcnp5(fsswref)) {
    ssw_mcnp_type = SSW_MCNP5;
  }
  assert(ssw_mcnp_type>0);
  char ref_mcnpflavour_str[64];
  ref_mcnpflavour_str[0] = '\0';
  ssw_strcat( ref_mcnpflavour_str,
              ssw_mcnpflavour(fsswref),
              sizeof(ref_mcnpflavour_str) );
  ssw_close_file(fsswref);

  //Grab the header:
  char * hdrbuf;
  {
    uint64_t actual_size;
    mcpl_read_file_to_buffer( refsswfile,
                              (uint64_t)ssw_hdrlen,
                              0,//not text
                              &actual_size,
                              &hdrbuf );
    if ( !hdrbuf || actual_size != (uint64_t)ssw_hdrlen )
      ssw_error("Problems extracting header from reference file");
  }

  int32_t orig_np1 = * ((int32_t*)(&hdrbuf[ssw_np1pos]));

  //Clear |np1| and nrss in header to to indicate incomplete info (we will
  //update just before closing the file):
  *((int32_t*)(&hdrbuf[ssw_np1pos])) = 0;
  *((int32_t*)(&hdrbuf[ssw_nrsspos])) = 0;

  printf("Creating (or overwriting) output SSW file.\n");

  //Open new ssw file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen( outsswfile );
  if (!fout.internal)
    ssw_error("Problems opening new SSW file");

  //Write header:
  mcpl_generic_fwrite( &fout, hdrbuf, ssw_hdrlen);
  free(hdrbuf);
  hdrbuf = NULL;

  double ssb[11];

  if ( ssw_ssblen != 10 && ssw_ssblen != 11)
    ssw_error("Unexpected length of ssb record in reference SSW file");
  if ( (ssw_mcnp_type == SSW_MCNP6) && ssw_ssblen != 11 )
    ssw_error("Unexpected length of ssb record in reference SSW file (expected 11 for MCNP6 files)");

  //ssb[0] should be history number (starting from 1), but in our case we always
  //put nhistories=nparticles, so it is simply incrementing by 1 for each particle.
  ssb[0] = 0.0;


  assert(surface_id>=0&&surface_id<1000000);


  long used = 0;
  long long skipped_nosswtype = 0;

  printf("Initiating particle conversion loop.\n");

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if (!mcpl_p)
      break;
    ++ssb[0];
    ssb[2] = mcpl_p->weight;
    ssb[3] = mcpl_p->ekin;//already in MeV
    ssb[4] = mcpl_p->time * 1.0e5;//milliseconds to "shakes"
    ssb[5] = mcpl_p->position[0];//already in cm
    ssb[6] = mcpl_p->position[1];//already in cm
    ssb[7] = mcpl_p->position[2];//already in cm
    ssb[8] = mcpl_p->direction[0];
    ssb[9] = mcpl_p->direction[1];

    int32_t isurf = surface_id;
    if (!isurf)
      isurf = (int32_t)mcpl_p->userflags;

    if (isurf<=0||isurf>1000000) {
      if (isurf==0&&surface_id==0)
        ssw_error("Could not determine surface ID: no global surface id specified and particle had no (or empty) userflags");
      else
        ssw_error("Surface id must be in range 1..999999");
    }

    int64_t rawtype;
    if (ssw_mcnp_type == SSW_MCNP6) {
      rawtype = conv_mcnp6_pdg2ssw(mcpl_p->pdgcode);
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      rawtype = conv_mcnpx_pdg2ssw(mcpl_p->pdgcode);
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      rawtype = (mcpl_p->pdgcode==2112?1:(mcpl_p->pdgcode==22?2:0));
    }

    if (!rawtype) {
      ++skipped_nosswtype;
      if (skipped_nosswtype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n",
               (long)mcpl_p->pdgcode,ref_mcnpflavour_str);
        if (skipped_nosswtype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    if ( !(rawtype>0 ) )
      ssw_error("Logic error in PDG code conversions.");
    assert(rawtype>0);

    if (ssw_mcnp_type == SSW_MCNP6) {
      assert(ssw_ssblen==11);
      ssb[10] = isurf;//Should we set the sign of ssb[10] to mean something (we take abs(ssb[10]) in sswread.c)?
      ssb[1] = (double)(((int64_t)rawtype)*4);//Shift 2 bits (thus we only create files with those two bits zero!)
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      ssb[1] = (double)(isurf + 1000000*((int64_t)rawtype));
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      //NOTE: We had for MCPL <=1.6.x: ssb[1] = (isurf + 1000000*rawtype)*8; But
      //now we try instead:
      ssb[1] = (double)((isurf + 100000000*((int64_t)rawtype))*8);
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    }

    //Sign of ssb[1] is used to store the sign of dirz:
    assert(ssb[1] >= 1.0);
    if (mcpl_p->direction[2]<0.0)
      ssb[1] = - ssb[1];

    ssw_writerecord(&fout,ssw_reclen,sizeof(double)*ssw_ssblen,(char*)&ssb[0]);
    if (++used==nparticles_limit) {
      long long remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nosswtype - used;
      if (remaining)
        printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n",
               nparticles_limit,remaining);
      break;
    }
  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nosswtype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to MCNP types.\n",(long long)skipped_nosswtype);
  }

  int32_t new_nrss = used;
  int32_t new_np1 = new_nrss;

  if (new_np1==0) {
    //SSW files must at least have 1 history (but can have 0 particles)
    printf("WARNING: Input MCPL file has 0 useful particles but we are setting number"
           " of histories in new SSW file to 1 to avoid creating an invalid file.\n");
    new_np1 = 1;
  }
  if (orig_np1<0)
    new_np1 = - new_np1;

  ssw_update_nparticles(&fout,ssw_np1pos,new_np1,ssw_nrsspos,new_nrss);

  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",outsswfile,(long long)new_nrss,(long long)labs(new_np1));
  return 1;


}